

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

BOOL __thiscall Memory::Recycler::FinishConcurrentCollect(Recycler *this,CollectionFlags flags)

{
  ObservableValue<Memory::CollectionState> *this_00;
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  CollectionFlags flags_00;
  BOOL BVar5;
  DWORD waitTime;
  size_t rescanRootBytes;
  Phase phase;
  undefined8 *in_FS_OFFSET;
  undefined1 local_40 [8];
  AutoProtectPages protectPages;
  
  if (((this->collectionState).value & Collection_Concurrent) == CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x16e9,"(false)","false");
    if (bVar3) {
      *puVar1 = 0;
      return 0;
    }
LAB_0028d4dc:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if ((flags >> 0x1c & 1) == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if ((this->priorityBoost & 1U) != 0) {
      bVar3 = this->backgroundRescanCount != '\x01';
    }
  }
  (this->collectionParam).priorityBoostConcurrentSweepOverride = this->priorityBoost;
  if ((flags >> 0xe & 1) == 0) {
    flags_00 = RecyclerHeuristic::FinishConcurrentCollectWaitTime(this->recyclerFlagsTable);
  }
  else {
    flags_00 = 0xffffffff;
  }
  BVar5 = WaitForConcurrentThread(this,flags_00,WaitReasonNone);
  if (BVar5 == 0) {
    return 0;
  }
  this_00 = &this->collectionState;
  if (this_00->value != CollectionStateTransferSweptWait) {
    if (this_00->value == CollectionStateRescanWait) {
      phase = ConcurrentMarkPhase;
      if (this->inPartialCollectMode != false) {
        phase = ConcurrentPartialCollectPhase;
      }
      PrintCollectTrace(this,phase,true,false);
      ObservableValue<Memory::CollectionState>::SetValue(this_00,CollectionStateRescanFindRoots);
      if ((this->isPageHeapEnabled == true) &&
         (this->recyclerFlagsTable->RecyclerProtectPagesOnRescan == true)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x1723,
                           "(!(IsPageHeapEnabled() && GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan))"
                           ,"ProtectPagesOnRescan not supported in page heap mode");
        if (!bVar4) goto LAB_0028d4dc;
        *puVar1 = 0;
      }
      AutoProtectPages::AutoProtectPages
                ((AutoProtectPages *)local_40,this,
                 this->recyclerFlagsTable->RecyclerProtectPagesOnRescan);
      if (((flags >> 0xe & 1) == 0 & bVar3) == 1) {
        bVar4 = (bool)((byte)(flags >> 0x14) & 1);
      }
      else {
        bVar4 = false;
      }
      waitTime = RecyclerHeuristic::BackgroundFinishMarkWaitTime(bVar4,this->recyclerFlagsTable);
      rescanRootBytes = FinishMark(this,waitTime);
      if (rescanRootBytes == 0xffffffffffffffff) {
        if ((this_00->value & CollectionStateMark) == CollectionStateNotCollecting) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar1 = (undefined4 *)*in_FS_OFFSET;
          *puVar1 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x172d,"(this->IsMarkState())","this->IsMarkState()");
          if (!bVar3) goto LAB_0028d4dc;
          *puVar1 = 0;
        }
        bVar3 = false;
      }
      else {
        (this->collectionStats).continueCollectAllocBytes = (this->autoHeap).uncollectedAllocBytes;
        if (this->recyclerFlagsTable->RecyclerVerifyMark == true) {
          VerifyMark(this);
        }
        AutoProtectPages::Unprotect((AutoProtectPages *)local_40);
        bVar3 = Sweep(this,rescanRootBytes,bVar3,true);
      }
      AutoProtectPages::~AutoProtectPages((AutoProtectPages *)local_40);
      if (rescanRootBytes == 0xffffffffffffffff) {
        return 0;
      }
      goto LAB_0028d486;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    flags_00 = 0x1776;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1776,"(this->collectionState == CollectionStateTransferSweptWait)",
                       "Do we need to handle this state?");
    if (!bVar3) goto LAB_0028d4dc;
    *puVar1 = 0;
  }
  FinishTransferSwept(this,flags_00);
  bVar3 = false;
LAB_0028d486:
  FinishCollection(this,bVar3);
  if ((this->collectionState).value == CollectionStateNotCollecting) {
    if ((this->inExhaustiveCollection == true) && ((this->hasExhaustiveCandidate & 1U) != 0)) {
      DoCollect(this,flags & ~CollectMode_Partial);
    }
    else {
      EndCollection(this);
    }
  }
  return 1;
}

Assistant:

BOOL
Recycler::FinishConcurrentCollect(CollectionFlags flags)
{
    if (!this->IsConcurrentState())
    {
        Assert(false);
        return false;
    }

#ifdef PROFILE_EXEC
    Js::Phase concurrentPhase = Js::ConcurrentCollectPhase;
    // TODO: Remove this workaround for unreferenced local after enabled -profile for GC
    static_cast<Js::Phase>(concurrentPhase);
#endif
#if ENABLE_PARTIAL_GC
    RECYCLER_PROFILE_EXEC_BEGIN2(this, Js::RecyclerPhase,
        (concurrentPhase = ((this->inPartialCollectMode && this->IsConcurrentMarkState())?
            Js::ConcurrentPartialCollectPhase : Js::ConcurrentCollectPhase)));
#else
    RECYCLER_PROFILE_EXEC_BEGIN2(this, Js::RecyclerPhase,
        (concurrentPhase = Js::ConcurrentCollectPhase));
#endif

    // Don't do concurrent sweep if we have priority boosted.
    const BOOL forceInThread = flags & CollectOverride_ForceInThread;
    bool concurrent = (flags & CollectMode_Concurrent) != 0;
    concurrent = concurrent && (!priorityBoost || this->backgroundRescanCount != 1);
#ifdef RECYCLER_TRACE
    collectionParam.priorityBoostConcurrentSweepOverride = priorityBoost;
#endif

    const DWORD waitTime = forceInThread? INFINITE : RecyclerHeuristic::FinishConcurrentCollectWaitTime(this->GetRecyclerFlagsTable());
    GCETW(GC_FINISHCONCURRENTWAIT_START, (this, waitTime));
    const BOOL waited = WaitForConcurrentThread(waitTime, RecyclerWaitReason::FinishConcurrentCollect);
    GCETW(GC_FINISHCONCURRENTWAIT_STOP, (this, !waited));
    if (!waited)
    {
        RECYCLER_PROFILE_EXEC_END2(this, concurrentPhase, Js::RecyclerPhase);
        return false;
    }

    bool needConcurrentSweep = false;
    if (collectionState == CollectionStateRescanWait)
    {
        GCETW_INTERNAL(GC_START, (this, ETWEvent_ConcurrentRescan));
        GCETW_INTERNAL(GC_START2, (this, ETWEvent_ConcurrentRescan, this->collectionStartReason, this->collectionStartFlags));

#ifdef RECYCLER_TRACE
#if ENABLE_PARTIAL_GC
        PrintCollectTrace(this->inPartialCollectMode ? Js::ConcurrentPartialCollectPhase : Js::ConcurrentMarkPhase, true);
#else
        PrintCollectTrace(Js::ConcurrentMarkPhase, true);
#endif
#endif
        SetCollectionState(CollectionStateRescanFindRoots);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        // TODO: Change this behavior
        // ProtectPagesOnRescan is not supported in PageHeap mode because the page protection is changed
        // outside the PageAllocator in PageHeap mode and so pages are not in the state that the
        // PageAllocator expects when it goes to change the page protection
        // One viable fix is to move the guard page protection logic outside of the heap blocks
        // and into the page allocator
        AssertMsg(!(IsPageHeapEnabled() && GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan), "ProtectPagesOnRescan not supported in page heap mode");
        AutoProtectPages protectPages(this, GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan);
#endif

        const bool backgroundFinishMark = !forceInThread && concurrent && ((flags & CollectOverride_BackgroundFinishMark) != 0);
        const DWORD finishMarkWaitTime = RecyclerHeuristic::BackgroundFinishMarkWaitTime(backgroundFinishMark, GetRecyclerFlagsTable());
        size_t rescanRootBytes = FinishMark(finishMarkWaitTime);

        if (rescanRootBytes == Recycler::InvalidScanRootBytes)
        {
            Assert(this->IsMarkState());
            RECYCLER_PROFILE_EXEC_END2(this, concurrentPhase, Js::RecyclerPhase);
            GCETW_INTERNAL(GC_STOP, (this, ETWEvent_ConcurrentRescan));
            GCETW_INTERNAL(GC_STOP2, (this, ETWEvent_ConcurrentRescan, this->collectionStartReason, this->collectionStartFlags));

            // we timeout trying to mark.
            return false;
        }

#ifdef RECYCLER_STATS
        collectionStats.continueCollectAllocBytes = autoHeap.uncollectedAllocBytes;
#endif

#ifdef RECYCLER_VERIFY_MARK
        if (GetRecyclerFlagsTable().RecyclerVerifyMark)
        {
            this->VerifyMark();
        }
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        protectPages.Unprotect();
#endif

#if ENABLE_PARTIAL_GC
        needConcurrentSweep = this->Sweep(rescanRootBytes, concurrent, true);
#else
        needConcurrentSweep = this->Sweep(concurrent);
#endif
        GCETW_INTERNAL(GC_STOP, (this, ETWEvent_ConcurrentRescan));
        GCETW_INTERNAL(GC_STOP2, (this, ETWEvent_ConcurrentRescan, this->collectionStartReason, this->collectionStartFlags));
    }
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    else if (collectionState == CollectionStateConcurrentSweepPass1Wait)
    {
        this->FinishSweepPrep();

        if (forceInThread)
        {
            this->FinishConcurrentSweepPass1();
            this->SetCollectionState(CollectionStateConcurrentSweepPass2);
#ifdef RECYCLER_TRACE
            if (this->GetRecyclerFlagsTable().Trace.IsEnabled(Js::ConcurrentSweepPhase) && CONFIG_FLAG_RELEASE(Verbose))
            {
                Output::Print(_u("[GC #%d] Finishing Sweep Pass2 in-thread. \n"), this->collectionCount);
            }
#endif
            this->recyclerSweepManager->FinishSweep();
            this->FinishConcurrentSweep();
            this->recyclerSweepManager->EndBackground();

            uint sweptBytes = 0;
#ifdef RECYCLER_STATS
            sweptBytes = (uint)collectionStats.objectSweptBytes;
#endif

            GCETW(GC_BACKGROUNDSWEEP_STOP, (this, sweptBytes));

            this->SetCollectionState(CollectionStateTransferSweptWait);
            RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::ConcurrentSweepPhase);

            FinishTransferSwept(flags);
        }
        else
        {
            needConcurrentSweep = true;
            // Signal the background thread to finish concurrent sweep Pass2 for all the buckets.
            StartConcurrent(CollectionStateConcurrentSweepPass2);
        }
    }
#endif
    else
    {
        AssertMsg(this->collectionState == CollectionStateTransferSweptWait, "Do we need to handle this state?");
        FinishTransferSwept(flags);
    }